

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O0

int hessian_fd2(custom_function *funcpt,double *x,int N,double *dx,double eps,double *f)

{
  double *pdVar1;
  void *__ptr;
  void *__ptr_00;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double *f2;
  double *stepsize;
  double stepmax;
  double temp2;
  double fc;
  double ft;
  double temp;
  double fd;
  int retval;
  int step;
  int j;
  int i;
  double *f_local;
  double eps_local;
  double *dx_local;
  int N_local;
  double *x_local;
  custom_function *funcpt_local;
  
  dVar2 = pow(eps,0.3333333333333333);
  __ptr = malloc((long)N << 3);
  __ptr_00 = malloc((long)N << 3);
  dVar3 = (*funcpt->funcpt)(x,N,funcpt->params);
  if ((1.79769313486232e+308 <= dVar3) || (dVar3 <= -1.79769313486232e+308)) {
    printf("Program Exiting as the function value exceeds the maximum double value");
    free(__ptr);
    free(__ptr_00);
    funcpt_local._4_4_ = 0xf;
  }
  else if (NAN(dVar3)) {
    printf("Program Exiting as the function returns NaN");
    free(__ptr);
    free(__ptr_00);
    funcpt_local._4_4_ = 0xf;
  }
  else {
    for (step = 0; step < N; step = step + 1) {
      if (ABS(x[step]) < 1.0 / ABS(dx[step])) {
        dVar4 = signx(x[step]);
        stepsize = (double *)((dVar4 * 1.0) / ABS(dx[step]));
      }
      else {
        stepsize = (double *)x[step];
      }
      *(double *)((long)__ptr + (long)step * 8) = dVar2 * (double)stepsize;
      dVar4 = x[step];
      x[step] = *(double *)((long)__ptr + (long)step * 8) + x[step];
      *(double *)((long)__ptr + (long)step * 8) = x[step] - dVar4;
      dVar5 = (*funcpt->funcpt)(x,N,funcpt->params);
      *(double *)((long)__ptr_00 + (long)step * 8) = dVar5;
      if ((1.79769313486232e+308 <= *(double *)((long)__ptr_00 + (long)step * 8)) ||
         (*(double *)((long)__ptr_00 + (long)step * 8) <= -1.79769313486232e+308)) {
        printf("Program Exiting as the function value exceeds the maximum double value");
        free(__ptr);
        free(__ptr_00);
        return 0xf;
      }
      dVar5 = *(double *)((long)__ptr_00 + (long)step * 8);
      pdVar1 = (double *)((long)__ptr_00 + (long)step * 8);
      if ((dVar5 != *pdVar1) || (NAN(dVar5) || NAN(*pdVar1))) {
        printf("Program Exiting as the function returns NaN");
        free(__ptr);
        free(__ptr_00);
        return 0xf;
      }
      x[step] = dVar4;
    }
    for (step = 0; step < N; step = step + 1) {
      dVar2 = x[step];
      dVar4 = *(double *)((long)__ptr + (long)step * 8);
      x[step] = dVar4 + dVar4 + x[step];
      dVar4 = (*funcpt->funcpt)(x,N,funcpt->params);
      if ((1.79769313486232e+308 <= dVar4) || (dVar4 <= -1.79769313486232e+308)) {
        printf("Program Exiting as the function value exceeds the maximum double value");
        free(__ptr);
        free(__ptr_00);
        return 0xf;
      }
      if (NAN(dVar4)) {
        printf("Program Exiting as the function returns NaN");
        free(__ptr);
        free(__ptr_00);
        return 0xf;
      }
      f[step * N + step] =
           (((dVar3 - *(double *)((long)__ptr_00 + (long)step * 8)) + dVar4) -
           *(double *)((long)__ptr_00 + (long)step * 8)) /
           (*(double *)((long)__ptr + (long)step * 8) * *(double *)((long)__ptr + (long)step * 8));
      x[step] = dVar2 + *(double *)((long)__ptr + (long)step * 8);
      retval = step;
      while (retval = retval + 1, retval < N) {
        dVar4 = x[retval];
        x[retval] = *(double *)((long)__ptr + (long)retval * 8) + x[retval];
        dVar5 = (*funcpt->funcpt)(x,N,funcpt->params);
        if ((1.79769313486232e+308 <= dVar5) || (dVar5 <= -1.79769313486232e+308)) {
          printf("Program Exiting as the function value exceeds the maximum double value");
          free(__ptr);
          free(__ptr_00);
          return 0xf;
        }
        if (NAN(dVar5)) {
          printf("Program Exiting as the function returns NaN");
          free(__ptr);
          free(__ptr_00);
          return 0xf;
        }
        f[step * N + retval] =
             (((dVar3 - *(double *)((long)__ptr_00 + (long)step * 8)) + dVar5) -
             *(double *)((long)__ptr_00 + (long)retval * 8)) /
             (*(double *)((long)__ptr + (long)step * 8) *
             *(double *)((long)__ptr + (long)retval * 8));
        x[retval] = dVar4;
      }
      x[step] = dVar2;
    }
    free(__ptr);
    free(__ptr_00);
    funcpt_local._4_4_ = 0;
  }
  return funcpt_local._4_4_;
}

Assistant:

int hessian_fd2(custom_function *funcpt,double *x,int N,double *dx,double eps,double *f) {
	int i,j,step,retval;
	double fd,temp,ft,fc,temp2,stepmax;
	double *stepsize,*f2;
	/*
	Returns Upper Triangular matrix only. If you want the full matrix then either use hessian_fd or copy the upper triangular value to lower triangle.
	*/
	fd = pow((double) eps,1.0/3.0);
	
	stepsize = (double*) malloc(sizeof(double) *N);
	f2 = (double*) malloc(sizeof(double) *N);
	retval = 0;
	fc = FUNCPT_EVAL(funcpt,x,N);
	if (fc >= DBL_MAX || fc <= -DBL_MAX) {
		printf("Program Exiting as the function value exceeds the maximum double value");
		free(stepsize);
		free(f2);
		return 15;
	}
	if (fc != fc) {
		printf("Program Exiting as the function returns NaN");
		free(stepsize);
		free(f2);
		return 15;
	}
	
	for(i = 0; i < N;++i) {
		if (fabs(x[i]) >= (1.0 / fabs(dx[i]))) {
			stepmax = x[i];
		} else {
			stepmax = signx(x[i]) * 1.0 / fabs(dx[i]);
		}
		stepsize[i] = fd * stepmax;
		temp = x[i];
		x[i] += stepsize[i];
		stepsize[i] = x[i] - temp;
		
		f2[i] = FUNCPT_EVAL(funcpt,x,N);
		if (f2[i] >= DBL_MAX || f2[i] <= -DBL_MAX) {
			printf("Program Exiting as the function value exceeds the maximum double value");
			free(stepsize);
			free(f2);
			return 15;
		}
		if (f2[i] != f2[i]) {
			printf("Program Exiting as the function returns NaN");
			free(stepsize);
			free(f2);
			return 15;
		}
		x[i] = temp;
	}
	
	for(i = 0; i < N;++i) { 
		step = i *N;
		temp = x[i];
		x[i] += 2*stepsize[i];
		ft = FUNCPT_EVAL(funcpt, x, N);
		if (ft >= DBL_MAX || ft <= -DBL_MAX) {
			printf("Program Exiting as the function value exceeds the maximum double value");
			free(stepsize);
			free(f2);
			return 15;
		}
		if (ft != ft) {
			printf("Program Exiting as the function returns NaN");
			free(stepsize);
			free(f2);
			return 15;
		}
		f[step+i] = (fc - f2[i] + ft - f2[i])/(stepsize[i] * stepsize[i]);
		x[i] = temp + stepsize[i];
		for(j = i+1; j < N;++j) {
			temp2 = x[j];
			x[j] += stepsize[j];
			ft = FUNCPT_EVAL(funcpt, x, N);
			if (ft >= DBL_MAX || ft <= -DBL_MAX) {
				printf("Program Exiting as the function value exceeds the maximum double value");
				free(stepsize);
				free(f2);
				return 15;
			}
			if (ft != ft) {
				printf("Program Exiting as the function returns NaN");
				free(stepsize);
				free(f2);
				return 15;
			}
			f[step+j] = (fc - f2[i] + ft - f2[j])/(stepsize[i] * stepsize[j]);
			x[j] = temp2;
		}
		x[i] = temp;
			
	}
	
	free(stepsize);
	free(f2);
	return retval;
}